

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void fillBackground(QPainter *p,QRectF *rect,QBrush *brush,QPointF *origin,QRectF *gradientRect)

{
  long lVar1;
  QGradient *this;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  long in_FS_OFFSET;
  byte bVar5;
  QTransform m;
  
  bVar5 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save(p);
  if (((brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->style - LinearGradientPattern < 3)
  {
    if ((((gradientRect->w != 0.0) || (NAN(gradientRect->w))) || (gradientRect->h != 0.0)) ||
       (NAN(gradientRect->h))) {
      pqVar3 = (qreal *)&DAT_005fb888;
      pQVar4 = &m;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        pQVar4->m_matrix[0][0] = *pqVar3;
        pqVar3 = pqVar3 + (ulong)bVar5 * -2 + 1;
        pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      pqVar3 = (qreal *)&DAT_005fb8d8;
      pQVar4 = &m;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pQVar4->m_matrix[0][0] = *pqVar3;
        pqVar3 = pqVar3 + (ulong)bVar5 * -2 + 1;
        pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      m._72_2_ = 0xa800;
      QTransform::translate(&m,gradientRect->xp,gradientRect->yp);
      QTransform::scale(&m,gradientRect->w,gradientRect->h);
      QBrush::setTransform(brush,&m);
      this = QBrush::gradient(brush);
      QGradient::setCoordinateMode(this,LogicalMode);
    }
  }
  else {
    QPainter::setBrushOrigin(p,origin);
  }
  QPainter::fillRect(p,rect,brush);
  QPainter::restore(p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fillBackground(QPainter *p, const QRectF &rect, QBrush brush, const QPointF &origin, const QRectF &gradientRect = QRectF())
{
    p->save();
    if (brush.style() >= Qt::LinearGradientPattern && brush.style() <= Qt::ConicalGradientPattern) {
        if (!gradientRect.isNull()) {
            QTransform m;
            m.translate(gradientRect.left(), gradientRect.top());
            m.scale(gradientRect.width(), gradientRect.height());
            brush.setTransform(m);
            const_cast<QGradient *>(brush.gradient())->setCoordinateMode(QGradient::LogicalMode);
        }
    } else {
        p->setBrushOrigin(origin);
    }
    p->fillRect(rect, brush);
    p->restore();
}